

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O2

int ctemplate_htmlparser::jsparser_state(jsparser_ctx *ctx)

{
  int iVar1;
  
  iVar1 = state_external(ctx->statemachine->current_state);
  return iVar1;
}

Assistant:

int jsparser_state(jsparser_ctx *ctx)
{
  return state_external(ctx->statemachine->current_state);
}